

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentBeforeValue(BuiltStyledStreamWriter *this,Value *root)

{
  bool bVar1;
  _Alloc_hider _Var2;
  String local_38;
  
  if (this->cs_ != None) {
    bVar1 = Value::hasComment(root,commentBefore);
    if (bVar1) {
      if ((this->field_0xd8 & 2) == 0) {
        writeIndent(this);
      }
      Value::getComment_abi_cxx11_(&local_38,root,commentBefore);
      for (_Var2._M_p = local_38._M_dataplus._M_p;
          _Var2._M_p != local_38._M_dataplus._M_p + local_38._M_string_length;
          _Var2._M_p = _Var2._M_p + 1) {
        std::operator<<((this->super_StreamWriter).sout_,*_Var2._M_p);
        if (((*_Var2._M_p == '\n') &&
            (_Var2._M_p + 1 != local_38._M_dataplus._M_p + local_38._M_string_length)) &&
           (_Var2._M_p[1] == '/')) {
          std::operator<<((this->super_StreamWriter).sout_,(string *)&this->indentString_);
        }
      }
      this->field_0xd8 = this->field_0xd8 & 0xfd;
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentBeforeValue(Value const& root) {
  if (cs_ == CommentStyle::None)
    return;
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_)
    writeIndent();
  const String& comment = root.getComment(commentBefore);
  String::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *sout_ << *iter;
    if (*iter == '\n' && ((iter + 1) != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would write extra newline
      *sout_ << indentString_;
    ++iter;
  }
  indented_ = false;
}